

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Output::outputUpToEndOfLine(Output *this,StringRef s)

{
  bool bVar1;
  reference pIVar2;
  StringRef local_40;
  Output *local_30;
  char *local_28;
  Output *local_20;
  Output *this_local;
  StringRef s_local;
  
  local_28 = (char *)s.Length;
  local_30 = (Output *)s.Data;
  local_20 = this;
  this_local = local_30;
  s_local.Data = local_28;
  output(this,s);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)&this->StateStack);
  if (!bVar1) {
    pIVar2 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    bVar1 = inFlowSeqAnyElement(*pIVar2);
    if (bVar1) {
      return;
    }
    pIVar2 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    bVar1 = inFlowMapAnyKey(*pIVar2);
    if (bVar1) {
      return;
    }
  }
  StringRef::StringRef(&local_40,"\n");
  (this->Padding).Data = local_40.Data;
  (this->Padding).Length = local_40.Length;
  return;
}

Assistant:

void Output::outputUpToEndOfLine(StringRef s) {
  output(s);
  if (StateStack.empty() || (!inFlowSeqAnyElement(StateStack.back()) &&
                             !inFlowMapAnyKey(StateStack.back())))
    Padding = "\n";
}